

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQClosure::Finalize(SQClosure *this)

{
  long lVar1;
  long in_RDI;
  SQInteger _n__1;
  SQInteger _n_;
  SQFunctionProto *f;
  SQObjectPtr *in_stack_ffffffffffffffe0;
  byte *this_00;
  long local_18;
  
  lVar1 = *(long *)(in_RDI + 0x48);
  for (local_18 = 0; local_18 < *(long *)(lVar1 + 0xb8); local_18 = local_18 + 1) {
    ::SQObjectPtr::Null(in_stack_ffffffffffffffe0);
  }
  for (this_00 = (byte *)0x0; (long)this_00 < *(long *)(lVar1 + 200);
      this_00 = (byte *)((long)&(((SQObjectPtr *)this_00)->super_SQObject)._type + 1)) {
    ::SQObjectPtr::Null((SQObjectPtr *)this_00);
  }
  return;
}

Assistant:

void Finalize(){
        SQFunctionProto *f = _function;
        _NULL_SQOBJECT_VECTOR(_outervalues,f->_noutervalues);
        _NULL_SQOBJECT_VECTOR(_defaultparams,f->_ndefaultparams);
    }